

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall RVO::Agent::insertObstacleNeighbor(Agent *this,Obstacle *obstacle,float rangeSq)

{
  float fVar1;
  float fVar2;
  iterator __position;
  pointer ppVar3;
  long lVar4;
  pointer ppVar5;
  long lVar6;
  Obstacle **ppOVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  pair<float,_const_RVO::Obstacle_*> local_38;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar8 = (this->position_).x_;
  fVar9 = (this->position_).y_;
  fVar1 = (obstacle->point_).x_;
  fVar2 = (obstacle->point_).y_;
  fVar11 = (obstacle->nextObstacle_->point_).x_;
  fVar10 = (obstacle->nextObstacle_->point_).y_;
  fVar15 = fVar8 - fVar1;
  fStack_24 = fVar11 - fVar1;
  fStack_20 = 0.0 - fVar1;
  fStack_1c = 0.0 - fVar1;
  fVar12 = fVar9 - fVar2;
  fVar13 = fVar10 - fVar2;
  fVar14 = (fStack_24 * fVar15 + fVar13 * fVar12) / (fStack_24 * fStack_24 + fVar13 * fVar13);
  if (0.0 <= fVar14) {
    if (fVar14 <= 1.0) {
      fVar11 = fVar1 + fStack_24 * fVar14;
      fVar10 = fVar2 + fVar13 * fVar14;
    }
    fVar9 = fVar9 - fVar10;
    fVar8 = fVar8 - fVar11;
    local_28 = fVar8 * fVar8 + fVar9 * fVar9;
    fStack_24 = 0.0;
    fStack_20 = 0.0;
    fStack_1c = 0.0;
  }
  else {
    local_28 = fVar15 * fVar15 + fVar12 * fVar12;
  }
  if (local_28 < rangeSq) {
    __position._M_current =
         (this->obstacleNeighbors_).
         super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->obstacleNeighbors_).
        super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38.first = local_28;
      local_38.second = obstacle;
      std::
      vector<std::pair<float,RVO::Obstacle_const*>,std::allocator<std::pair<float,RVO::Obstacle_const*>>>
      ::_M_realloc_insert<std::pair<float,RVO::Obstacle_const*>>
                ((vector<std::pair<float,RVO::Obstacle_const*>,std::allocator<std::pair<float,RVO::Obstacle_const*>>>
                  *)&this->obstacleNeighbors_,__position,&local_38);
      ppVar5 = (this->obstacleNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *(ulong *)__position._M_current = CONCAT44(local_38._4_4_,local_28);
      (__position._M_current)->second = obstacle;
      ppVar5 = (this->obstacleNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->obstacleNeighbors_).
      super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
    }
    ppVar3 = (this->obstacleNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Obstacle_*>,_std::allocator<std::pair<float,_const_RVO::Obstacle_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)ppVar5 - (long)ppVar3 >> 4;
    lVar4 = lVar6 + -1;
    if (lVar4 != 0) {
      ppOVar7 = &ppVar3[lVar6 + -1].second;
      do {
        if (*(float *)(ppOVar7 + -3) <= local_28) goto LAB_0010894f;
        ((pair<float,_const_RVO::Obstacle_*> *)(ppOVar7 + -1))->first = *(float *)(ppOVar7 + -3);
        *ppOVar7 = ppOVar7[-2];
        ppOVar7 = ppOVar7 + -2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    lVar4 = 0;
LAB_0010894f:
    ppVar3[lVar4].first = local_28;
    ppVar3[lVar4].second = obstacle;
  }
  return;
}

Assistant:

void Agent::insertObstacleNeighbor(const Obstacle *obstacle, float rangeSq)
	{
		const Obstacle *const nextObstacle = obstacle->nextObstacle_;

		const float distSq = distSqPointLineSegment(obstacle->point_, nextObstacle->point_, position_);

		if (distSq < rangeSq) {
			obstacleNeighbors_.push_back(std::make_pair(distSq, obstacle));

			size_t i = obstacleNeighbors_.size() - 1;

			while (i != 0 && distSq < obstacleNeighbors_[i - 1].first) {
				obstacleNeighbors_[i] = obstacleNeighbors_[i - 1];
				--i;
			}

			obstacleNeighbors_[i] = std::make_pair(distSq, obstacle);
		}
	}